

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O2

MockSpec<int_(int,_int)> * __thiscall
testing::internal::FunctionMocker<int_(int,_int)>::With
          (FunctionMocker<int_(int,_int)> *this,Matcher<int> *m1,Matcher<int> *m2)

{
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> local_40;
  
  std::_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>::_Tuple_impl(&local_40,m1,m2)
  ;
  std::_Tuple_impl<0ul,testing::Matcher<int>,testing::Matcher<int>>::
  _M_assign<testing::Matcher<int>,testing::Matcher<int>>
            ((_Tuple_impl<0ul,testing::Matcher<int>,testing::Matcher<int>> *)
             &(this->super_FunctionMockerBase<int_(int,_int)>).current_spec_.matchers_,&local_40);
  std::_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>::~_Tuple_impl(&local_40);
  return &(this->super_FunctionMockerBase<int_(int,_int)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::testing::make_tuple(m1, m2));
    return this->current_spec();
  }